

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToSortedBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  int iVar1;
  iterator __base;
  value_type *ppIVar2;
  ImGuiWindow *child;
  int i;
  int count;
  ImGuiWindow *window_local;
  ImVector<ImGuiWindow_*> *out_sorted_windows_local;
  
  _i = window;
  window_local = (ImGuiWindow *)out_sorted_windows;
  ImVector<ImGuiWindow_*>::push_back(out_sorted_windows,(value_type *)&i);
  if ((_i->Active & 1U) != 0) {
    iVar1 = (_i->DC).ChildWindows.Size;
    if (1 < iVar1) {
      __base = ImVector<ImGuiWindow_*>::begin(&(_i->DC).ChildWindows);
      qsort(__base,(long)iVar1,8,ChildWindowComparer);
    }
    for (child._0_4_ = 0; (int)child < iVar1; child._0_4_ = (int)child + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&(_i->DC).ChildWindows,(int)child);
      if (((*ppIVar2)->Active & 1U) != 0) {
        AddWindowToSortedBuffer((ImVector<ImGuiWindow_*> *)window_local,*ppIVar2);
      }
    }
  }
  return;
}

Assistant:

static void AddWindowToSortedBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            qsort(window->DC.ChildWindows.begin(), (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortedBuffer(out_sorted_windows, child);
        }
    }
}